

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O3

bool __thiscall Item::operator<(Item *this,Item *o)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  runtime_error *this_00;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  char _error_msg_ [256];
  char acStack_118 [264];
  
  uVar1 = this->ndims;
  if (uVar1 != o->ndims) {
    snprintf(acStack_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ndims == o.ndims",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x11);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,acStack_118);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = o->key;
  iVar3 = this->key;
  bVar6 = SBORROW4(iVar3,iVar2);
  bVar5 = iVar3 - iVar2 < 0;
  if (iVar3 == iVar2) {
    if (0 < (int)uVar1) {
      uVar4 = 0;
      do {
        iVar2 = (o->w).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start[uVar4];
        iVar3 = (this->w).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4];
        bVar6 = SBORROW4(iVar3,iVar2);
        bVar5 = iVar3 - iVar2 < 0;
        if (iVar3 != iVar2) goto LAB_00103547;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    bVar6 = SBORROW4(this->demand,o->demand);
    bVar5 = this->demand - o->demand < 0;
  }
LAB_00103547:
  return bVar6 != bVar5;
}

Assistant:

bool Item::operator<(const Item &o) const {
	throw_assert(ndims == o.ndims);
	if (abs(key - o.key) >= 1e-5) {
		return key < o.key;
	}
	for (int i = 0; i < ndims; i++) {
		if (w[i] != o.w[i]) {
			return w[i] < o.w[i];
		}
	}
	return demand < o.demand;
}